

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O0

string_t duckdb::HexIntegralOperator::Operation<long,duckdb::string_t>(long input,Vector *result)

{
  idx_t iVar1;
  string_t *this;
  ulong buffer_size_00;
  char *pcVar2;
  Vector *in_RSI;
  uint64_t in_RDI;
  anon_union_16_2_67f50693_for_value aVar3;
  char *output;
  char *output_1;
  idx_t buffer_size;
  idx_t num_bits_to_check;
  idx_t num_leading_zero;
  string_t target;
  uint64_t in_stack_000001c8;
  char *local_48;
  string_t *in_stack_ffffffffffffffc0;
  
  iVar1 = CountZeros<unsigned_long>::Leading(in_stack_000001c8);
  this = (string_t *)(-iVar1 + 0x40);
  buffer_size_00 = -iVar1 + 0x43 >> 2;
  if (buffer_size_00 == 0) {
    aVar3 = (anon_union_16_2_67f50693_for_value)duckdb::StringVector::EmptyString(in_RSI,1);
    pcVar2 = string_t::GetDataWriteable(in_stack_ffffffffffffffc0);
    *pcVar2 = '0';
    string_t::Finalize(this);
  }
  else {
    aVar3 = (anon_union_16_2_67f50693_for_value)
            duckdb::StringVector::EmptyString(in_RSI,buffer_size_00);
    local_48 = string_t::GetDataWriteable(in_stack_ffffffffffffffc0);
    WriteHexBytes(in_RDI,&local_48,buffer_size_00);
    string_t::Finalize(this);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar3.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		auto num_leading_zero = CountZeros<uint64_t>::Leading(static_cast<uint64_t>(input));
		idx_t num_bits_to_check = 64 - num_leading_zero;
		D_ASSERT(num_bits_to_check <= sizeof(INPUT_TYPE) * 8);

		idx_t buffer_size = (num_bits_to_check + 3) / 4;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHexBytes(static_cast<uint64_t>(input), output, buffer_size);

		target.Finalize();
		return target;
	}